

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O0

int __thiscall ot::commissioner::MockSocket::Receive(MockSocket *this,uint8_t *aBuf,size_t aMaxLen)

{
  size_t __dest;
  bool bVar1;
  unsigned_long *puVar2;
  uchar *__src;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  const_iterator local_50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  const_iterator local_40;
  size_type local_38;
  size_t local_30;
  unsigned_long len;
  size_t aMaxLen_local;
  uint8_t *aBuf_local;
  MockSocket *this_local;
  
  len = aMaxLen;
  aMaxLen_local = (size_t)aBuf;
  aBuf_local = (uint8_t *)this;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->mRecvBuf);
  if (bVar1) {
    this_local._4_4_ = -0x6900;
  }
  else {
    local_38 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mRecvBuf);
    puVar2 = std::min<unsigned_long>(&len,&local_38);
    __dest = aMaxLen_local;
    local_30 = *puVar2;
    __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->mRecvBuf);
    memcpy((void *)__dest,__src,local_30);
    local_48._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->mRecvBuf)
    ;
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_40,&local_48);
    local_60._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->mRecvBuf)
    ;
    local_58 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_60,local_30);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_50,&local_58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
              (&this->mRecvBuf,local_40,local_50);
    this_local._4_4_ = (int)local_30;
  }
  return this_local._4_4_;
}

Assistant:

int MockSocket::Receive(uint8_t *aBuf, size_t aMaxLen)
{
    if (mRecvBuf.empty())
    {
        return MBEDTLS_ERR_SSL_WANT_READ;
    }
    auto len = std::min(aMaxLen, mRecvBuf.size());
    memcpy(aBuf, mRecvBuf.data(), len);
    mRecvBuf.erase(mRecvBuf.begin(), mRecvBuf.begin() + len);
    return static_cast<int>(len);
}